

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::ShapeOrder
               (TPZVec<long> *id,TPZVec<int> *order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  int *piVar2;
  int i;
  long i_00;
  
  iVar1 = *order->fStore;
  if (shapeorders->fRows != (long)iVar1 + 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapelinear.cpp"
               ,0x123);
  }
  piVar2 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
  *piVar2 = 1;
  piVar2 = TPZGenMatrix<int>::operator()(shapeorders,1,0);
  *piVar2 = 1;
  for (i_00 = 2; i_00 <= iVar1; i_00 = i_00 + 1) {
    piVar2 = TPZGenMatrix<int>::operator()(shapeorders,i_00,0);
    *piVar2 = (int)i_00;
  }
  return;
}

Assistant:

void TPZShapeLinear::ShapeOrder(const TPZVec<int64_t> &id, const TPZVec<int> &order, TPZGenMatrix<int> &shapeorders)//, TPZVec<int64_t> &sides
    {
        int nshape = 2+(order[0]-1);
        if (shapeorders.Rows() != nshape) {
            DebugStop();
        }
        shapeorders(0,0) = 1;
        shapeorders(1,0) = 1;
        for (int i=2; i<nshape; i++) {
            shapeorders(i,0) = i;
        }
    }